

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O1

void __thiscall kratos::AssertValueStmt::AssertValueStmt(AssertValueStmt *this)

{
  shared_ptr<kratos::Var> local_38;
  element_type *local_28;
  pointer ppStack_20;
  
  Const::constant(0,1,false);
  Var::as<kratos::Const>((Var *)&stack0xffffffffffffffd8);
  local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_20;
  local_28 = (element_type *)0x0;
  ppStack_20 = (pointer)0x0;
  AssertValueStmt(this,&local_38);
  if ((pointer)local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (ppStack_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_20);
  }
  return;
}

Assistant:

AssertValueStmt::AssertValueStmt() : AssertValueStmt(constant(0, 1).as<Const>()) {}